

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContext.h
# Opt level: O0

unique_ptr<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>_>
__thiscall jaegertracing::SpanContext::Clone(SpanContext *this)

{
  SpanContext *this_00;
  SpanContext *in_RSI;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  SpanContext *this_local;
  
  std::lock_guard<std::mutex>::lock_guard(&local_20,&in_RSI->_mutex);
  this_00 = (SpanContext *)operator_new(0xb0);
  SpanContext(this_00,in_RSI);
  std::unique_ptr<opentracing::v3::SpanContext,std::default_delete<opentracing::v3::SpanContext>>::
  unique_ptr<std::default_delete<opentracing::v3::SpanContext>,void>
            ((unique_ptr<opentracing::v3::SpanContext,std::default_delete<opentracing::v3::SpanContext>>
              *)this,(pointer)this_00);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return (__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
          )(__uniq_ptr_data<opentracing::v3::SpanContext,_std::default_delete<opentracing::v3::SpanContext>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<opentracing::SpanContext> Clone() const noexcept override
    {
        std::lock_guard<std::mutex> lock(_mutex);
        return std::unique_ptr<opentracing::SpanContext>(
            new SpanContext(*this));
    }